

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_parse.cc
# Opt level: O3

int absl::lts_20250127::(anonymous_namespace)::ConsumeDigits<10,unsigned_long>
              (char *begin,char *end,int max_digits,unsigned_long *out,bool *dropped_nonzero_digit)

{
  ulong uVar1;
  byte *pbVar2;
  byte *pbVar3;
  byte *pbVar4;
  bool bVar5;
  ulong uVar6;
  long lVar7;
  unsigned_long uVar8;
  
  if (0x13 < max_digits) {
    __assert_fail("max_digits <= std::numeric_limits<T>::digits10",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/charconv_parse.cc"
                  ,0xfc,
                  "int absl::lts_20250127::(anonymous namespace)::ConsumeDigits(const char *, const char *, int, T *, bool *) [base = 10, T = unsigned long]"
                 );
  }
  uVar8 = *out;
  pbVar2 = (byte *)begin;
  if (begin != end && uVar8 == 0) {
    do {
      if (*pbVar2 != 0x30) break;
      pbVar2 = pbVar2 + 1;
    } while (pbVar2 != (byte *)end);
  }
  pbVar4 = pbVar2 + max_digits;
  if ((long)end - (long)pbVar2 <= (long)max_digits) {
    pbVar4 = (byte *)end;
  }
  pbVar3 = pbVar2;
  if (pbVar2 < pbVar4) {
    lVar7 = (long)pbVar4 - (long)pbVar2;
    do {
      pbVar3 = pbVar2;
      if (9 < (byte)(*pbVar2 - 0x30)) break;
      uVar1 = uVar8 * 10;
      if (uVar1 < uVar8) {
        __assert_fail("accumulator * base >= accumulator",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/charconv_parse.cc"
                      ,0x10e,
                      "int absl::lts_20250127::(anonymous namespace)::ConsumeDigits(const char *, const char *, int, T *, bool *) [base = 10, T = unsigned long]"
                     );
      }
      uVar6 = (ulong)(*pbVar2 & 0xf);
      uVar8 = uVar1 + uVar6;
      if (CARRY8(uVar1,uVar6)) {
        __assert_fail("accumulator + digit >= accumulator",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/charconv_parse.cc"
                      ,0x110,
                      "int absl::lts_20250127::(anonymous namespace)::ConsumeDigits(const char *, const char *, int, T *, bool *) [base = 10, T = unsigned long]"
                     );
      }
      pbVar2 = pbVar2 + 1;
      lVar7 = lVar7 + -1;
      pbVar3 = pbVar4;
    } while (lVar7 != 0);
  }
  if (pbVar3 < end) {
    lVar7 = (long)end - (long)pbVar3;
    pbVar2 = pbVar3 + lVar7;
    bVar5 = false;
    pbVar4 = pbVar3;
    do {
      pbVar3 = pbVar4;
      if (9 < (byte)(*pbVar4 - 0x30)) break;
      bVar5 = (bool)(bVar5 | *pbVar4 != 0x30);
      pbVar4 = pbVar4 + 1;
      lVar7 = lVar7 + -1;
      pbVar3 = pbVar2;
    } while (lVar7 != 0);
    if ((dropped_nonzero_digit != (bool *)0x0) && (bVar5)) {
      *dropped_nonzero_digit = true;
    }
  }
  *out = uVar8;
  return (int)pbVar3 - (int)begin;
}

Assistant:

int ConsumeDigits(const char* begin, const char* end, int max_digits, T* out,
                  bool* dropped_nonzero_digit) {
  if (base == 10) {
    assert(max_digits <= std::numeric_limits<T>::digits10);
  } else if (base == 16) {
    assert(max_digits * 4 <= std::numeric_limits<T>::digits);
  }
  const char* const original_begin = begin;

  // Skip leading zeros, but only if *out is zero.
  // They don't cause an overflow so we don't have to count them for
  // `max_digits`.
  while (!*out && end != begin && *begin == '0') ++begin;

  T accumulator = *out;
  const char* significant_digits_end =
      (end - begin > max_digits) ? begin + max_digits : end;
  while (begin < significant_digits_end && IsDigit<base>(*begin)) {
    // Do not guard against *out overflow; max_digits was chosen to avoid this.
    // Do assert against it, to detect problems in debug builds.
    auto digit = static_cast<T>(ToDigit<base>(*begin));
    assert(accumulator * base >= accumulator);
    accumulator *= base;
    assert(accumulator + digit >= accumulator);
    accumulator += digit;
    ++begin;
  }
  bool dropped_nonzero = false;
  while (begin < end && IsDigit<base>(*begin)) {
    dropped_nonzero = dropped_nonzero || (*begin != '0');
    ++begin;
  }
  if (dropped_nonzero && dropped_nonzero_digit != nullptr) {
    *dropped_nonzero_digit = true;
  }
  *out = accumulator;
  return static_cast<int>(begin - original_begin);
}